

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t *self)

{
  uint local_1c;
  cf_uint32_t i;
  cf_hashtbl_t *self_local;
  
  local_1c = 0;
  while( true ) {
    if (self->hashmsk < local_1c) {
      return (cf_hashtbl_iter_t)0x0;
    }
    if (self->table[local_1c] != (hashtbl_node_t *)0x0) break;
    local_1c = local_1c + 1;
  }
  return self->table[local_1c];
}

Assistant:

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t* self) {
    cf_uint32_t i;
    /* find the first table index */
    for (i = 0; i <= self->hashmsk; i++) {
        if (self->table[i]) {
            return self->table[i];
        }
    }
    return CF_NULL_PTR;
}